

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Synthesizer.cpp
# Opt level: O3

void __thiscall Synthesizer::Voice::Process(Voice *this,float *l,float *r)

{
  UInt32 UVar1;
  float *pfVar2;
  int iVar3;
  UInt32 UVar4;
  int i;
  long lVar5;
  UInt32 UVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  pfVar2 = this->p;
  fVar7 = pfVar2[2] * this->fenv + pfVar2[1];
  fVar12 = pfVar2[3];
  fVar7 = ((ABS(fVar7 + -0.0001) - ABS(fVar7 + -0.99)) + 0.9901) * 0.5;
  fVar8 = this->aenv * this->amp;
  if (this->rampcount < 0x40) {
    iVar3 = this->rampcount + 1;
    this->rampcount = iVar3;
    fVar8 = fVar8 * (float)iVar3 * 0.015625;
  }
  UVar4 = this->channels[0].freq;
  fVar10 = 0.0;
  lVar5 = 0;
  do {
    UVar1 = this->channels[0].phase[lVar5];
    iVar3 = 8;
    UVar6 = UVar1;
    do {
      fVar10 = fVar10 + (float)(UVar6 & this->channels[0].mask);
      UVar6 = UVar6 + UVar4;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    this->channels[0].phase[lVar5] = UVar1 + UVar4 * 8;
    UVar4 = UVar4 + this->channels[0].detune;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  fVar9 = (1.0 - fVar12) * (1.0 - fVar12);
  fVar7 = fVar7 * fVar7 * 0.707;
  fVar10 = (fVar10 + -4.0) * 1.4551915e-11;
  fVar12 = this->channels[0].bpf;
  fVar11 = fVar7 * fVar12 + this->channels[0].lpf;
  fVar12 = ((fVar10 - fVar11) - fVar12 * fVar9) * fVar7 + fVar12;
  fVar11 = fVar7 * fVar12 + fVar11;
  this->channels[0].lpf = fVar11;
  this->channels[0].bpf = ((fVar10 - fVar11) - fVar12 * fVar9) * fVar7 + fVar12;
  *l = fVar11 * fVar8 + *l;
  UVar4 = this->channels[1].freq;
  fVar12 = 0.0;
  lVar5 = 0;
  do {
    UVar1 = this->channels[1].phase[lVar5];
    iVar3 = 8;
    UVar6 = UVar1;
    do {
      fVar12 = fVar12 + (float)(UVar6 & this->channels[1].mask);
      UVar6 = UVar6 + UVar4;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    this->channels[1].phase[lVar5] = UVar1 + UVar4 * 8;
    UVar4 = UVar4 + this->channels[1].detune;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  fVar10 = (fVar12 + -4.0) * 1.4551915e-11;
  fVar12 = this->channels[1].bpf;
  fVar11 = fVar7 * fVar12 + this->channels[1].lpf;
  fVar12 = ((fVar10 - fVar11) - fVar12 * fVar9) * fVar7 + fVar12;
  fVar11 = fVar7 * fVar12 + fVar11;
  this->channels[1].lpf = fVar11;
  this->channels[1].bpf = ((fVar10 - fVar11) - fVar9 * fVar12) * fVar7 + fVar12;
  *r = fVar11 * fVar8 + *r;
  this->aenv = this->aenv * this->aenvdecay + 1e-11;
  this->fenv = this->fenv * this->fenvdecay + 1e-11;
  return;
}

Assistant:

inline void Process(float& l, float& r)
        {
            float cut = FastClip(p[P_CUTOFF] + p[P_CUTENV] * fenv, 0.0001f, 0.99f); cut = cut * cut * 0.707f;
            float bw = 1.0f - p[P_RESONANCE]; bw *= bw;
            float ramped_amp = aenv * amp;
            if (rampcount < RAMPSAMPLES)
                ramped_amp *= (++rampcount) * RAMPSCALE;
            l += channels[0].Process(cut, bw) * ramped_amp;
            r += channels[1].Process(cut, bw) * ramped_amp;
            aenv = aenv * aenvdecay + 1.0e-11f;
            fenv = fenv * fenvdecay + 1.0e-11f;
        }